

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

bool ImGui::TableBeginContextMenuPopup(ImGuiTable *table)

{
  bool bVar1;
  ImU32 *in_RDI;
  ImGuiID context_menu_id;
  ImGuiWindowFlags in_stack_0000001c;
  ImGuiID in_stack_00000020;
  bool local_1;
  
  if (((*(byte *)((long)in_RDI + 0x20e) & 1) == 0) ||
     ((short)in_RDI[0x20] != *(short *)((long)in_RDI + 0x82))) {
    local_1 = false;
  }
  else {
    ImHashStr("##ContextMenu",0,*in_RDI);
    bVar1 = BeginPopupEx(in_stack_00000020,in_stack_0000001c);
    if (bVar1) {
      local_1 = true;
    }
    else {
      *(undefined1 *)((long)in_RDI + 0x20e) = 0;
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool ImGui::TableBeginContextMenuPopup(ImGuiTable* table)
{
    if (!table->IsContextPopupOpen || table->InstanceCurrent != table->InstanceInteracted)
        return false;
    const ImGuiID context_menu_id = ImHashStr("##ContextMenu", 0, table->ID);
    if (BeginPopupEx(context_menu_id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings))
        return true;
    table->IsContextPopupOpen = false;
    return false;
}